

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinedH264Demuxer.cpp
# Opt level: O1

int __thiscall
CombinedH264Demuxer::simpleDemuxBlock
          (CombinedH264Demuxer *this,DemuxedData *demuxedData,PIDSet *acceptedPIDs,
          int64_t *discardSize)

{
  CombinedH264Reader *this_00;
  long lVar1;
  size_t __n;
  pointer puVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ReadState RVar6;
  undefined4 extraout_var;
  uint8_t *dataEnd;
  uint8_t *puVar7;
  uint8_t *end;
  size_t sVar8;
  pointer __src;
  uint8_t *data;
  bool isFirstBlock;
  uint32_t readedBytes;
  int readRez;
  uint local_5c;
  int64_t *local_58;
  int local_4c;
  MemoryBlock *local_48;
  uint8_t *local_40;
  uint8_t *local_38;
  
  this_00 = &this->super_CombinedH264Reader;
  if ((this->super_CombinedH264Reader).m_firstDemuxCall == true) {
    CombinedH264Reader::fillPids(this_00,acceptedPIDs,0);
    (this->super_CombinedH264Reader).m_firstDemuxCall = false;
  }
  *discardSize = 0;
  local_4c = 0;
  iVar4 = (*this->m_bufferedReader->_vptr_AbstractReader[2])
                    (this->m_bufferedReader,(ulong)(uint)this->m_readerID,&local_5c,&local_4c);
  if (local_4c == 2) {
    this->m_lastReadRez = 2;
    iVar4 = 2;
  }
  else if (((this->super_CombinedH264Reader).m_tmpBuffer.m_size + (ulong)local_5c == 0) ||
          ((local_5c == 0 && (this->m_lastReadRez == 1)))) {
    this->m_lastReadRez = local_4c;
    iVar4 = 1;
  }
  else {
    if (local_5c != 0) {
      (*this->m_bufferedReader->_vptr_AbstractReader[5])();
    }
    this->m_lastReadRez = local_4c;
    lVar1 = CONCAT44(extraout_var,iVar4) + (ulong)local_5c;
    end = (uint8_t *)(lVar1 + 0x80);
    data = (uint8_t *)(CONCAT44(extraout_var,iVar4) + 0x80);
    __n = (this->super_CombinedH264Reader).m_tmpBuffer.m_size;
    if (__n != 0) {
      data = data + -__n;
      puVar2 = (this->super_CombinedH264Reader).m_tmpBuffer.m_data.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      __src = (pointer)0x0;
      if (puVar2 != (this->super_CombinedH264Reader).m_tmpBuffer.m_data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        __src = puVar2;
      }
      memcpy(data,__src,__n);
      (this->super_CombinedH264Reader).m_tmpBuffer.m_size = 0;
    }
    local_48 = &(this->super_CombinedH264Reader).m_tmpBuffer;
    dataEnd = NALUnit::findNALWithStartCode(data + 3,end,true);
    local_38 = (uint8_t *)(lVar1 + 0x7c);
    local_58 = discardSize;
    local_40 = end;
    do {
      if (local_38 <= data) {
        if (end <= data) {
          return 0;
        }
        if (this->m_lastReadRez == 1) {
          if ((this->super_CombinedH264Reader).m_state == Primary) {
            CombinedH264Reader::addDataToPrimary(this_00,data,end,demuxedData,discardSize);
            return 0;
          }
          CombinedH264Reader::addDataToSecondary(this_00,data,end,demuxedData,discardSize);
          return 0;
        }
        sVar8 = (long)end - (long)data;
        if (sVar8 == 0) {
          return 0;
        }
        MemoryBlock::grow(local_48,sVar8);
        memcpy((this->super_CombinedH264Reader).m_tmpBuffer.m_data.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start +
               ((this->super_CombinedH264Reader).m_tmpBuffer.m_size - sVar8),data,sVar8);
        return 0;
      }
      uVar5 = CombinedH264Reader::getPrefixLen(data,end);
      if (uVar5 == 0) {
LAB_00181f97:
        RVar6 = (this->super_CombinedH264Reader).m_state;
        if (RVar6 == Primary) {
          CombinedH264Reader::addDataToPrimary(this_00,data,dataEnd,demuxedData,discardSize);
        }
        else {
          if (RVar6 == Both) {
            CombinedH264Reader::addDataToPrimary(this_00,data,dataEnd,demuxedData,discardSize);
            end = local_40;
          }
          CombinedH264Reader::addDataToSecondary(this_00,data,dataEnd,demuxedData,discardSize);
        }
        puVar7 = NALUnit::findNALWithStartCode(dataEnd + 3,end,true);
        bVar3 = true;
        data = dataEnd;
      }
      else {
        RVar6 = CombinedH264Reader::detectStreamByNal(this_00,data + uVar5,dataEnd);
        (this->super_CombinedH264Reader).m_state = RVar6;
        if (RVar6 != NeedMoreData) goto LAB_00181f97;
        sVar8 = (long)end - (long)data;
        if (0x7f < (long)sVar8) {
          (this->super_CombinedH264Reader).m_state = Primary;
          discardSize = local_58;
          goto LAB_00181f97;
        }
        if (end != data) {
          MemoryBlock::grow(local_48,sVar8);
          memcpy((this->super_CombinedH264Reader).m_tmpBuffer.m_data.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start +
                 ((this->super_CombinedH264Reader).m_tmpBuffer.m_size - sVar8),data,sVar8);
        }
        bVar3 = false;
        discardSize = local_58;
        puVar7 = dataEnd;
      }
      dataEnd = puVar7;
    } while (bVar3);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int CombinedH264Demuxer::simpleDemuxBlock(DemuxedData& demuxedData, const PIDSet& acceptedPIDs, int64_t& discardSize)
{
    if (m_firstDemuxCall)
    {
        fillPids(acceptedPIDs, 0);
        m_firstDemuxCall = false;
    }

    discardSize = 0;

    uint32_t readedBytes;
    int readRez = 0;
    bool isFirstBlock = false;
    uint8_t* data = m_bufferedReader->readBlock(m_readerID, readedBytes, readRez, &isFirstBlock);  // blocked read mode
    if (readRez == BufferedFileReader::DATA_NOT_READY)
    {
        m_lastReadRez = readRez;
        return BufferedFileReader::DATA_NOT_READY;
    }

    if (readedBytes + m_tmpBuffer.size() == 0 || (readedBytes == 0 && m_lastReadRez == BufferedReader::DATA_EOF))
    {
        m_lastReadRez = readRez;
        return BufferedReader::DATA_EOF;
    }
    if (readedBytes > 0)
        m_bufferedReader->notify(m_readerID, readedBytes);
    m_lastReadRez = readRez;
    data += MAX_TMP_BUFFER_SIZE;
    uint8_t* dataEnd = data + readedBytes;
    if (m_tmpBuffer.size() > 0)
    {
        data -= m_tmpBuffer.size();
        memcpy(data, m_tmpBuffer.data(), m_tmpBuffer.size());
        m_tmpBuffer.clear();
    }
    uint8_t* curNal = data;

    uint8_t* nextNal = NALUnit::findNALWithStartCode(curNal + 3, dataEnd, true);
    while (curNal < dataEnd - 4)
    {
        const int prefixLen = getPrefixLen(curNal, dataEnd);
        if (prefixLen != 0)
        {
            m_state = detectStreamByNal(curNal + prefixLen, nextNal);
            if (m_state == ReadState::NeedMoreData)
            {
                if (dataEnd - curNal < MAX_TMP_BUFFER_SIZE)
                {
                    m_tmpBuffer.append(curNal, dataEnd - curNal);
                    return 0;
                }
                // some error in a stream, just ignore
                m_state = ReadState::Primary;
            }
        }
        if (m_state == ReadState::Both)
        {
            addDataToPrimary(curNal, nextNal, demuxedData, discardSize);
            addDataToSecondary(curNal, nextNal, demuxedData, discardSize);
        }
        else if (m_state == ReadState::Primary)
            addDataToPrimary(curNal, nextNal, demuxedData, discardSize);
        else
            addDataToSecondary(curNal, nextNal, demuxedData, discardSize);
        curNal = nextNal;
        nextNal = NALUnit::findNALWithStartCode(curNal + 3, dataEnd, true);
    }

    if (curNal < dataEnd)
    {
        if (m_lastReadRez == BufferedReader::DATA_EOF)
        {
            if (m_state == ReadState::Primary)
                addDataToPrimary(curNal, dataEnd, demuxedData, discardSize);
            else
                addDataToSecondary(curNal, dataEnd, demuxedData, discardSize);
        }
        else
        {
            m_tmpBuffer.append(curNal, dataEnd - curNal);
        }
    }

    return 0;
}